

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void model_rd_for_sb_y(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                      RD_STATS *rd_stats,uint *var_out,int calculate_rd,int *early_term)

{
  TX_SIZE TVar1;
  int iVar2;
  MACROBLOCK *in_RCX;
  long in_RDX;
  byte in_SIL;
  MACROBLOCK *in_RDI;
  int *in_R8;
  int *in_R9;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000008;
  int *in_stack_00000010;
  int64_t *in_stack_00000018;
  int bhigh;
  int bwide;
  int force_skip;
  uint var;
  int64_t dist;
  int rate;
  uint sse;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int ref;
  int local_70;
  uint local_6c;
  undefined8 local_58;
  int local_50;
  uint local_4c;
  tran_low_t **local_48;
  int local_34;
  int in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  if ((*(int *)(in_RDX + 0x15244) != 0) && (in_stack_00000010 != (int *)0x0)) {
    *in_stack_00000010 = 1;
    *in_R8 = 0;
    in_R8[2] = 0;
    in_R8[3] = 0;
    in_R8[6] = 0;
    in_R8[7] = 0;
  }
  local_34 = (int)*(char *)(*(long *)(in_RCX->e_mbd).plane[2].seg_qmatrix[5][8] + 0x10);
  local_48 = &in_RCX->plane[0].qcoeff;
  iVar2 = (**(code **)(in_RDI->plane[0].src_diff + (ulong)in_SIL * 0x38 + 0x648c))
                    (*(undefined8 *)(in_RDX + 0x30),*(undefined4 *)(in_RDX + 0x48),
                     in_RCX->plane[0].eobs,*(undefined4 *)&in_RCX->plane[0].src.buf0,&local_4c);
  TVar1 = calculate_tx_size((AV1_COMP *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                            (BLOCK_SIZE)((ulong)in_RDX >> 0x38),in_RCX,(uint)((ulong)in_R8 >> 0x20),
                            (uint)in_R8,in_R9);
  *(TX_SIZE *)(*(long *)(in_RCX->e_mbd).plane[2].seg_qmatrix[5][8] + 0x91) = TVar1;
  if (in_R9 != (int *)0x0) {
    *in_R9 = iVar2;
  }
  if (in_stack_00000008 == 0) {
    local_50 = 0x7fffffff;
    local_58 = 0x7fffffff;
  }
  else {
    model_rd_with_curvfit
              (unaff_retaddr,in_RDI,(BLOCK_SIZE)((uint)uVar3 >> 0x18),in_stack_fffffffffffffff0,
               in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_00000010,in_stack_00000018);
  }
  *(ulong *)(in_R8 + 6) = (ulong)local_4c;
  if (local_4c == 0xffffffff) {
    local_6c = 0xffffffff;
  }
  else {
    local_6c = local_4c;
  }
  *(uint *)(in_RDX + 0x25660 + (long)local_34 * 4) = local_6c;
  *(bool *)(in_R8 + 8) = local_50 == 0;
  if (local_50 < 0x7fffffff) {
    local_70 = local_50;
  }
  else {
    local_70 = 0x7fffffff;
  }
  *in_R8 = local_70;
  *(undefined8 *)(in_R8 + 2) = local_58;
  return;
}

Assistant:

static void model_rd_for_sb_y(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              MACROBLOCK *x, MACROBLOCKD *xd,
                              RD_STATS *rd_stats, unsigned int *var_out,
                              int calculate_rd, int *early_term) {
  if (x->force_zeromv_skip_for_blk && early_term != NULL) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  assert(bsize < BLOCK_SIZES_ALL);

  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  unsigned int sse;
  int rate;
  int64_t dist;

  unsigned int var = cpi->ppi->fn_ptr[bsize].vf(
      p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, &sse);
  int force_skip = 0;
  xd->mi[0]->tx_size = calculate_tx_size(cpi, bsize, x, var, sse, &force_skip);
  if (var_out) {
    *var_out = var;
  }

  if (calculate_rd && (!force_skip || ref == INTRA_FRAME)) {
    const int bwide = block_size_wide[bsize];
    const int bhigh = block_size_high[bsize];
    model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, sse, bwide * bhigh, &rate,
                          &dist);
  } else {
    rate = INT_MAX;  // this will be overwritten later with av1_block_yrd
    dist = INT_MAX;
  }
  rd_stats->sse = sse;
  x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

  if (force_skip && ref > INTRA_FRAME) {
    rate = 0;
    dist = (int64_t)sse << 4;
  }

  assert(rate >= 0);

  rd_stats->skip_txfm = (rate == 0);
  rate = AOMMIN(rate, INT_MAX);
  rd_stats->rate = rate;
  rd_stats->dist = dist;
}